

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketio_berkeley.c
# Opt level: O0

int socketio_close(CONCRETE_IO_HANDLE socket_io,ON_IO_CLOSE_COMPLETE on_io_close_complete,
                  void *callback_context)

{
  SOCKET_IO_INSTANCE *socket_io_instance;
  int result;
  void *callback_context_local;
  ON_IO_CLOSE_COMPLETE on_io_close_complete_local;
  CONCRETE_IO_HANDLE socket_io_local;
  
  if (socket_io == (CONCRETE_IO_HANDLE)0x0) {
    socket_io_instance._4_4_ = 0x397;
  }
  else {
    if ((*(int *)((long)socket_io + 0x50) != 0) && (*(int *)((long)socket_io + 0x50) != 3)) {
      shutdown(*socket_io,2);
      close(*socket_io);
      *(undefined4 *)socket_io = 0xffffffff;
      *(undefined4 *)((long)socket_io + 0x50) = 0;
    }
    if (on_io_close_complete != (ON_IO_CLOSE_COMPLETE)0x0) {
      (*on_io_close_complete)(callback_context);
    }
    socket_io_instance._4_4_ = 0;
  }
  return socket_io_instance._4_4_;
}

Assistant:

int socketio_close(CONCRETE_IO_HANDLE socket_io, ON_IO_CLOSE_COMPLETE on_io_close_complete, void* callback_context)
{
    int result = 0;

    if (socket_io == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        SOCKET_IO_INSTANCE* socket_io_instance = (SOCKET_IO_INSTANCE*)socket_io;
        if ((socket_io_instance->io_state != IO_STATE_CLOSED) && (socket_io_instance->io_state != IO_STATE_CLOSING))
        {
            // Only close if the socket isn't already in the closed or closing state
            (void)shutdown(socket_io_instance->socket, SHUT_RDWR);
            close(socket_io_instance->socket);
            socket_io_instance->socket = INVALID_SOCKET;
            socket_io_instance->io_state = IO_STATE_CLOSED;
        }

        if (on_io_close_complete != NULL)
        {
            on_io_close_complete(callback_context);
        }

        result = 0;
    }

    return result;
}